

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * __thiscall
AI::create_MoveToDestination
          (Task *__return_storage_ptr__,AI *this,float walkSpeed,Vector3 debugSphereColour,
          float acceptanceRadius,bool stopOnOverlap,bool usePathfinding,int parameterIndex)

{
  vector<float,_std::allocator<float>_> *this_00;
  undefined3 in_register_00000009;
  Vector3 local_58;
  float local_4c;
  string local_48;
  
  local_4c = walkSpeed;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"moveToDestination",(allocator<char> *)&local_58);
  Task::Task(__return_storage_ptr__,&local_48,Simple);
  std::__cxx11::string::~string((string *)&local_48);
  __return_storage_ptr__->action = MoveToDestination;
  this_00 = &(__return_storage_ptr__->parameters).values;
  std::vector<float,_std::allocator<float>_>::push_back(this_00,&local_4c);
  local_58.x = 1.0;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,&local_58.x);
  local_58.z = 1.0;
  local_58.y = 1.0;
  if ((char)this == '\0') {
    local_58.y = 0.0;
  }
  if (!stopOnOverlap) {
    local_58.z = 0.0;
  }
  local_58.x = acceptanceRadius;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::emplace_back<Math::Vector3>
            (&(__return_storage_ptr__->parameters).vectors,&local_58);
  local_58.x = 1.4013e-45;
  local_58.y = (float)CONCAT31(in_register_00000009,usePathfinding);
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(__return_storage_ptr__->postconditions).satisfiedPredicates,
             (SatisfiablePredicateParams *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Task create_MoveToDestination(float walkSpeed, Math::Vector3 debugSphereColour, float acceptanceRadius = 1.f, bool stopOnOverlap = true, bool usePathfinding = true, int parameterIndex = -1)
	{
		/*
		Parameters:
		values: 
		0 is walk speed
		1 is NeedsMoveToCalled
		*/
		Task moveToDestination {"moveToDestination"};
		moveToDestination.action = Action::MoveToDestination;
		moveToDestination.parameters.values.push_back(walkSpeed);
		moveToDestination.parameters.values.push_back(1.f);
		moveToDestination.parameters.vectors.push_back({acceptanceRadius, stopOnOverlap ? 1.f : 0.f, usePathfinding ? 1.f : 0.f});
		
		moveToDestination.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearDestination, parameterIndex});
		
		return moveToDestination;
	}